

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O2

uint8_t __thiscall VL53L0X::getVcselPulsePeriod(VL53L0X *this,vl53l0xVcselPeriodType type)

{
  uint8_t uVar1;
  
  if (type == VcselPeriodPreRange) {
    uVar1 = 'P';
  }
  else {
    if (type != VcselPeriodFinalRange) {
      return 0xff;
    }
    uVar1 = 'p';
  }
  uVar1 = readRegister(this,uVar1);
  return uVar1 * '\x02' + '\x02';
}

Assistant:

uint8_t VL53L0X::getVcselPulsePeriod(vl53l0xVcselPeriodType type) {
	if (type == VcselPeriodPreRange) {
		return decodeVcselPeriod(this->readRegister(PRE_RANGE_CONFIG_VCSEL_PERIOD));
	} else if (type == VcselPeriodFinalRange) {
		return decodeVcselPeriod(this->readRegister(FINAL_RANGE_CONFIG_VCSEL_PERIOD));
	} else {
		return 255;
	}
}